

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<float> *
cimg_library::CImg<float>::vector
          (float *a0,float *a1,float *a2,float *a3,float *a4,float *a5,float *a6,float *a7)

{
  float *pfVar1;
  int iVar2;
  float *in_RCX;
  float *pfVar3;
  float *in_RDX;
  float *in_RSI;
  CImg<float> *in_RDI;
  float *in_R8;
  float *in_R9;
  float *in_stack_00000008;
  float *ptr;
  float *in_stack_00000018;
  uint in_stack_00000050;
  uint in_stack_00000054;
  CImg<float> *in_stack_00000058;
  
  if (vector(float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&)
      ::r == '\0') {
    iVar2 = __cxa_guard_acquire(&vector(float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&)
                                 ::r);
    if (iVar2 != 0) {
      CImg(in_stack_00000058,in_stack_00000054,in_stack_00000050,a0._4_4_,(uint)a0);
      __cxa_atexit(~CImg,&vector::r,&__dso_handle);
      __cxa_guard_release(&vector(float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&)
                           ::r);
    }
  }
  pfVar1 = vector::r._data;
  pfVar3 = vector::r._data + 1;
  *vector::r._data = *in_RSI;
  *pfVar3 = *in_RDX;
  pfVar1[2] = *in_RCX;
  pfVar1[3] = *in_R8;
  pfVar1[4] = *in_R9;
  pfVar1[5] = *in_stack_00000008;
  pfVar1[6] = *ptr;
  pfVar1[7] = *in_stack_00000018;
  CImg((CImg<float> *)a0,(CImg<float> *)a1);
  return in_RDI;
}

Assistant:

static CImg<T> vector(const T& a0, const T& a1, const T& a2, const T& a3,
                          const T& a4, const T& a5, const T& a6, const T& a7) {
      _cimg_static CImg<T> r(1,8); T *ptr = r._data;
      *(ptr++) = a0; *(ptr++) = a1; *(ptr++) = a2; *(ptr++) = a3;
      *(ptr++) = a4; *(ptr++) = a5; *(ptr++) = a6; *(ptr++) = a7;
      return r;
    }